

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmVariableDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprVariableDefinition *node)

{
  SynBase *pSVar1;
  VmModule *pVVar2;
  VmType VVar3;
  VmValueType VVar4;
  undefined8 uVar5;
  TypeBase *variable_00;
  bool bVar6;
  uint count;
  TypeRef *structType;
  VmConstant *pVVar7;
  VmConstant *pVVar8;
  VmValue *pVVar9;
  VmConstant *el1;
  VmValue *pVVar10;
  VmType type;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  VmValue *in_stack_fffffffffffffe78;
  VmValue *initializer_5;
  VmValue *initializer_4;
  VmValue *initializer_3;
  VmValue *initializer_2;
  VmValue *initializer_1;
  VmValue *initializer;
  VmValue *address;
  VmType vmType;
  VariableData *variable;
  ExprVariableDefinition *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  vmType.structType = (TypeBase *)node->variable->variable;
  if (node->initializer == (ExprBase *)0x0) {
    if ((((((VariableData *)vmType.structType)->isVmAlloca & 1U) == 0) &&
        ((((VariableData *)vmType.structType)->lookupOnly & 1U) == 0)) &&
       (bVar6 = IsLocalScope(((VariableData *)vmType.structType)->scope), bVar6)) {
      _address = GetVmType(ctx,(TypeBase *)(vmType.structType)->importModule);
      variable_00 = vmType.structType;
      pSVar1 = (node->super_ExprBase).source;
      structType = ExpressionContext::GetReferenceType
                             (ctx,(TypeBase *)(vmType.structType)->importModule);
      pVVar10 = anon_unknown.dwarf_c91b1::CreateVariableAddress
                          (module,pSVar1,(VariableData *)variable_00,&structType->super_TypeBase);
      bVar6 = VmType::operator==((VmType *)&address,&VmType::Int);
      if (((bVar6) || (bVar6 = VmType::operator==((VmType *)&address,&VmType::Double), bVar6)) ||
         (bVar6 = VmType::operator==((VmType *)&address,&VmType::Long), bVar6)) {
        pVVar7 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,_address);
        anon_unknown.dwarf_c91b1::CreateStore
                  (ctx,module,(node->super_ExprBase).source,
                   (TypeBase *)(vmType.structType)->importModule,pVVar10,&pVVar7->super_VmValue,0);
      }
      else {
        VVar4 = (VmValueType)address;
        if ((VmValueType)address == VM_TYPE_POINTER) {
          pVVar7 = CreateConstantPointer
                             (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                              (TypeBase *)(vmType.structType)->importModule,false);
          anon_unknown.dwarf_c91b1::CreateStore
                    (ctx,module,(node->super_ExprBase).source,
                     (TypeBase *)(vmType.structType)->importModule,pVVar10,&pVVar7->super_VmValue,0)
          ;
        }
        else {
          bVar6 = (VmValueType)address == VM_TYPE_FUNCTION_REF;
          pVVar9 = address;
          uVar5 = vmType._0_8_;
          if (bVar6) {
            pVVar2 = (VmModule *)(node->super_ExprBase).source;
            pVVar7 = CreateConstantPointer
                               (module->allocator,(node->super_ExprBase).source,0,
                                (VariableData *)0x0,ctx->typeNullPtr,false);
            pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
            VVar3 = _address;
            type.structType = (TypeBase *)pVVar7;
            vmType.type = (VmValueType)uVar5;
            vmType.size = SUB84(uVar5,4);
            type.type = vmType.type;
            type.size = vmType.size;
            _address = VVar3;
            pVVar9 = anon_unknown.dwarf_c91b1::CreateConstruct
                               ((anon_unknown_dwarf_c91b1 *)module,pVVar2,(SynBase *)pVVar9,type,
                                &pVVar8->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                                in_stack_fffffffffffffe78);
            anon_unknown.dwarf_c91b1::CreateStore
                      (ctx,module,(node->super_ExprBase).source,
                       (TypeBase *)(vmType.structType)->importModule,pVVar10,pVVar9,0);
          }
          else if (VVar4 == VM_TYPE_ARRAY_REF) {
            pVVar2 = (VmModule *)(node->super_ExprBase).source;
            pVVar7 = CreateConstantPointer
                               (module->allocator,(node->super_ExprBase).source,0,
                                (VariableData *)0x0,ctx->typeNullPtr,false);
            pVVar8 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
            VVar3 = _address;
            type_00.structType = (TypeBase *)pVVar7;
            vmType.type = (VmValueType)uVar5;
            vmType.size = SUB84(uVar5,4);
            type_00.type = vmType.type;
            type_00.size = vmType.size;
            _address = VVar3;
            pVVar9 = anon_unknown.dwarf_c91b1::CreateConstruct
                               ((anon_unknown_dwarf_c91b1 *)module,pVVar2,(SynBase *)pVVar9,type_00,
                                &pVVar8->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                                in_stack_fffffffffffffe78);
            anon_unknown.dwarf_c91b1::CreateStore
                      (ctx,module,(node->super_ExprBase).source,
                       (TypeBase *)(vmType.structType)->importModule,pVVar10,pVVar9,0);
          }
          else if (VVar4 == VM_TYPE_AUTO_REF) {
            pVVar2 = (VmModule *)(node->super_ExprBase).source;
            pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
            pVVar8 = CreateConstantPointer
                               (module->allocator,(node->super_ExprBase).source,0,
                                (VariableData *)0x0,ctx->typeNullPtr,false);
            VVar3 = _address;
            type_01.structType = (TypeBase *)pVVar7;
            vmType.type = (VmValueType)uVar5;
            vmType.size = SUB84(uVar5,4);
            type_01.type = vmType.type;
            type_01.size = vmType.size;
            _address = VVar3;
            pVVar9 = anon_unknown.dwarf_c91b1::CreateConstruct
                               ((anon_unknown_dwarf_c91b1 *)module,pVVar2,(SynBase *)pVVar9,type_01,
                                &pVVar8->super_VmValue,(VmValue *)0x0,(VmValue *)0x0,
                                in_stack_fffffffffffffe78);
            anon_unknown.dwarf_c91b1::CreateStore
                      (ctx,module,(node->super_ExprBase).source,
                       (TypeBase *)(vmType.structType)->importModule,pVVar10,pVVar9,0);
          }
          else if (VVar4 == VM_TYPE_AUTO_ARRAY) {
            pVVar2 = (VmModule *)(node->super_ExprBase).source;
            pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
            pVVar8 = CreateConstantPointer
                               (module->allocator,(node->super_ExprBase).source,0,
                                (VariableData *)0x0,ctx->typeNullPtr,false);
            el1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
            VVar3 = _address;
            type_02.structType = (TypeBase *)pVVar7;
            vmType.type = (VmValueType)uVar5;
            vmType.size = SUB84(uVar5,4);
            type_02.type = vmType.type;
            type_02.size = vmType.size;
            _address = VVar3;
            pVVar9 = anon_unknown.dwarf_c91b1::CreateConstruct
                               ((anon_unknown_dwarf_c91b1 *)module,pVVar2,(SynBase *)pVVar9,type_02,
                                &pVVar8->super_VmValue,&el1->super_VmValue,(VmValue *)0x0,
                                in_stack_fffffffffffffe78);
            anon_unknown.dwarf_c91b1::CreateStore
                      (ctx,module,(node->super_ExprBase).source,
                       (TypeBase *)(vmType.structType)->importModule,pVVar10,pVVar9,0);
          }
          else if (VVar4 == VM_TYPE_STRUCT) {
            if (address._4_4_ != 0) {
              pSVar1 = (node->super_ExprBase).source;
              count = address._4_4_ >> 2;
              VVar3.structType = VmType::Int.structType;
              VVar3.type = VmType::Int.type;
              VVar3.size = VmType::Int.size;
              pVVar7 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,VVar3);
              anon_unknown.dwarf_c91b1::CreateSetRange
                        (module,pSVar1,pVVar10,count,&pVVar7->super_VmValue,4);
            }
          }
          else {
            bVar6 = VmType::operator!=((VmType *)&address,&VmType::Void);
            if (bVar6) {
              __assert_fail("!\"unknown type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0xd72,
                            "VmValue *CompileVmVariableDefinition(ExpressionContext &, VmModule *, ExprVariableDefinition *)"
                           );
            }
          }
        }
      }
    }
  }
  else {
    CompileVm(ctx,module,node->initializer);
  }
  pVVar10 = anon_unknown.dwarf_c91b1::CreateVoid(module);
  pVVar10 = anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,pVVar10);
  return pVVar10;
}

Assistant:

VmValue* CompileVmVariableDefinition(ExpressionContext &ctx, VmModule *module, ExprVariableDefinition *node)
{
	VariableData *variable = node->variable->variable;

	if(node->initializer)
	{
		CompileVm(ctx, module, node->initializer);
	}
	else if(!variable->isVmAlloca && !variable->lookupOnly && IsLocalScope(variable->scope))
	{
		VmType vmType = GetVmType(ctx, variable->type);

		VmValue *address = CreateVariableAddress(module, node->source, variable, ctx.GetReferenceType(variable->type));

		if(vmType == VmType::Int || vmType == VmType::Double || vmType == VmType::Long)
		{
			VmValue *initializer = CreateConstantZero(ctx.allocator, node->source, vmType);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_POINTER)
		{
			VmValue *initializer = CreateConstantPointer(module->allocator, node->source, 0, NULL, variable->type, false);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_FUNCTION_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_ARRAY_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_AUTO_REF)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_AUTO_ARRAY)
		{
			VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL);

			CreateStore(ctx, module, node->source, variable->type, address, initializer, 0);
		}
		else if(vmType.type == VM_TYPE_STRUCT)
		{
			if(vmType.size != 0)
				CreateSetRange(module, node->source, address, vmType.size / 4, CreateConstantZero(ctx.allocator, node->source, VmType::Int), 4);
		}
		else if(vmType != VmType::Void)
		{
			assert(!"unknown type");
		}
	}

	return CheckType(ctx, node, CreateVoid(module));
}